

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi_socket_unix.cxx
# Opt level: O0

int ndiSocketRead(NDISocketHandle socket,char *reply,int numberOfBytesToRead,bool isBinary,
                 int *outErrorCode)

{
  int iVar1;
  ssize_t sVar2;
  unsigned_short size;
  bool binarySizeCalculated;
  int numberOfBytesRead;
  int totalNumberOfBytesToRead;
  int totalNumberOfBytesRead;
  int *outErrorCode_local;
  bool isBinary_local;
  int numberOfBytesToRead_local;
  char *reply_local;
  NDISocketHandle socket_local;
  
  numberOfBytesRead = 0;
  _size = numberOfBytesToRead;
  do {
    sVar2 = recv(socket,reply + numberOfBytesRead,(long)numberOfBytesToRead,0);
    if ((int)sVar2 < 1) {
      return -1;
    }
    numberOfBytesRead = (int)sVar2 + numberOfBytesRead;
    if ((!isBinary) && (reply[(int)(numberOfBytesRead - 1)] == '\r')) {
      return numberOfBytesRead;
    }
    if (((isBinary) && (iVar1 = strncmp(reply,"ERROR",5), iVar1 == 0)) &&
       (reply[(int)(numberOfBytesRead - 1)] == '\r')) {
      return numberOfBytesRead;
    }
    if (((isBinary) && (*reply == -0x3c)) && (reply[1] == -0x5b)) {
      _size = (uint)(ushort)(*(short *)(reply + 2) + 8);
    }
  } while (numberOfBytesRead != _size);
  return numberOfBytesRead;
}

Assistant:

ndicapiExport int ndiSocketRead(NDISocketHandle socket, char* reply, int numberOfBytesToRead, bool isBinary, int* outErrorCode)
{
  int totalNumberOfBytesRead = 0;
  int totalNumberOfBytesToRead = numberOfBytesToRead;
  int numberOfBytesRead;
  bool binarySizeCalculated = false;

  do
  {
    numberOfBytesRead = recv(socket, reply + totalNumberOfBytesRead, numberOfBytesToRead, 0);

    if (numberOfBytesRead < 1)
    {
      return -1;
    }

    totalNumberOfBytesRead += numberOfBytesRead;
    if (!isBinary && reply[totalNumberOfBytesRead - 1] == '\r'       /* done when carriage return received (ASCII) or when ERROR... received (binary)*/
        || isBinary && strncmp(reply, "ERROR", 5) == 0 && reply[totalNumberOfBytesRead - 1] == '\r')
    {
      break;
    }

    if (isBinary && !binarySizeCalculated && reply[0] == (char)0xc4 && reply[1] == (char)0xa5)
    {
      // recalculate n based on the reply length (reported from ndi device) and the amount of data received so far
      unsigned short size = ((unsigned char)reply[2] | (unsigned char)reply[3] << 8) + 8; // 8 bytes -> 2 for Start Sequence (a5c4), 2 for reply length, 2 for header CRC, 2 for CRC16
      totalNumberOfBytesToRead = size;
    }
  }
  while (totalNumberOfBytesRead != totalNumberOfBytesToRead);

  return totalNumberOfBytesRead;
}